

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::ReadMotorSupplyVoltageBit(AmpIO *this,uint index)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  uint local_28;
  uint local_24;
  uint32_t status;
  uint32_t dig_in;
  bool ret;
  AmpIO *pAStack_18;
  uint index_local;
  AmpIO *this_local;
  
  status._3_1_ = 0;
  dig_in = index;
  pAStack_18 = this;
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (7 < uVar2) {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x514c4131) {
      if (((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0) &&
         (pBVar1 = (this->super_FpgaIO).super_BoardIO.port,
         uVar3 = (*pBVar1->_vptr_BasePort[0x23])
                           (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,10,&local_24),
         (uVar3 & 1) != 0)) {
        status._3_1_ = (local_24 & 0x10000000) != 0;
      }
    }
    else {
      uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
      if (((uVar2 == 0x44514c41) &&
          (((dig_in == 1 || (dig_in == 2)) &&
           ((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0)))) &&
         (pBVar1 = (this->super_FpgaIO).super_BoardIO.port,
         uVar3 = (*pBVar1->_vptr_BasePort[0x23])
                           (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0,&local_28),
         (uVar3 & 1) != 0)) {
        status._3_1_ = (local_28 & dig_in << 4) != 0;
      }
    }
  }
  this_local._7_1_ = (bool)(status._3_1_ & 1);
  return this_local._7_1_;
}

Assistant:

bool AmpIO::ReadMotorSupplyVoltageBit(unsigned int index) const
{
    bool ret = false;
    if (GetFirmwareVersion() < 8) return ret;

    if (GetHardwareVersion() == QLA1_String) {
        // Bit 28 in digital I/O register
        uint32_t dig_in;
        if (port && port->ReadQuadlet(BoardId, 0x0a, dig_in))
            ret = (dig_in&0x10000000);

    }
    else if ((GetHardwareVersion() == DQLA_String) && ((index == 1) || (index == 2))) {
        // Bits 5 (QLA2) and 4 (QLA1) in status register
        uint32_t status;
        if (port && port->ReadQuadlet(BoardId, BoardIO::BOARD_STATUS, status))
            ret = (status & (index << 4) );
    }
    return ret;
}